

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_amigahunk.c
# Opt level: O3

char * gethunkname(HunkInfo *hi)

{
  long *plVar1;
  uint32_t uVar2;
  uint uVar3;
  char *__dest;
  long offset;
  ulong __n;
  
  uVar2 = nextword32(hi);
  uVar3 = uVar2 & 0xffffff;
  if (uVar3 == 0) {
    __dest = (char *)0x0;
  }
  else {
    __n = (ulong)(uVar3 << 2);
    __dest = (char *)alloczero((ulong)(uVar3 * 4 + 4));
    strncpy(__dest,(char *)hi->hunkptr,__n);
    plVar1 = &hi->hunkcnt;
    *plVar1 = *plVar1 - __n;
    if (*plVar1 < 0) {
      error(0xd,hi->filename);
    }
    hi->hunkptr = hi->hunkptr + __n;
  }
  return __dest;
}

Assistant:

static char *gethunkname(struct HunkInfo *hi)
/* read 32-bit aligned name, the most significant byte of the */
/* length specifier is ignored (for HUNK_EXT names, for example) */
{
  uint32_t n;
  char *s=NULL;

  if (n = nextword32(hi) & 0xffffff) {  /* name given? */
    s = alloczero((n+1)<<2);
    strncpy(s,(char *)hi->hunkptr,n<<2);
    movehunkptr32(hi,n);
  }
  return s;
}